

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O1

size_t SSL_get_server_random(SSL *ssl,uint8_t *out,size_t max_out)

{
  size_t __n;
  
  if (max_out != 0) {
    __n = 0x20;
    if (max_out < 0x20) {
      __n = max_out;
    }
    memcpy(out,ssl->s3->server_random,__n);
  }
  return 0x20;
}

Assistant:

size_t SSL_get_server_random(const SSL *ssl, uint8_t *out, size_t max_out) {
  if (max_out == 0) {
    return sizeof(ssl->s3->server_random);
  }
  if (max_out > sizeof(ssl->s3->server_random)) {
    max_out = sizeof(ssl->s3->server_random);
  }
  OPENSSL_memcpy(out, ssl->s3->server_random, max_out);
  return max_out;
}